

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

history_t * HISTORY_create(void)

{
  history_t *phVar1;
  chess_state_t s;
  chess_state_t local_a0;
  
  phVar1 = (history_t *)malloc(0x2008);
  STATE_reset(&local_a0);
  phVar1->idx = 0;
  phVar1->hash[0] = local_a0.hash;
  return phVar1;
}

Assistant:

history_t *HISTORY_create()
{
    history_t *h = (history_t*)malloc(sizeof(history_t));
    HISTORY_reset(h);
    return h;
}